

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O2

void __thiscall
chrono::ChFrameMoving<double>::ArchiveIN(ChFrameMoving<double> *this,ChArchiveIn *marchive)

{
  ChNameValue<chrono::ChCoordsys<double>_> local_48;
  ChNameValue<chrono::ChCoordsys<double>_> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChFrameMoving<double>>(marchive);
  ChFrame<double>::ArchiveIN(&this->super_ChFrame<double>,marchive);
  local_30._value = &this->coord_dt;
  local_30._name = "coord_dt";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->coord_dtdt;
  local_48._name = "coord_dtdt";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  return;
}

Assistant:

virtual void ArchiveIN(ChArchiveIn& marchive) override {
        // version number
        /*int version =*/marchive.VersionRead<ChFrameMoving>();

        // deserialize parent class
        ChFrame<Real>::ArchiveIN(marchive);

        // stream in all member data
        marchive >> CHNVP(coord_dt);
        marchive >> CHNVP(coord_dtdt);
    }